

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

int __thiscall prometheus::Gateway::push(Gateway *this,HttpMethod method)

{
  int iVar1;
  pointer ppVar2;
  element_type *peVar3;
  int iVar4;
  undefined8 uVar5;
  pointer collectable;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar6;
  bool bVar7;
  TextSerializer serializer;
  string body;
  string uri;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  int local_ac;
  pthread_mutex_t *local_a8;
  Serializer local_90;
  string local_88;
  string local_68;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_48;
  
  local_90._vptr_Serializer = (_func_int **)&PTR__Serializer_00125cf8;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar4 != 0) {
    uVar5 = ::std::__throw_system_error(iVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&local_48);
    if (unaff_R14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R14);
    }
    pthread_mutex_unlock(local_a8);
    _Unwind_Resume(uVar5);
  }
  collectable = (this->collectables_).
                super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->collectables_).
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 200;
  if (collectable != ppVar2) {
    do {
      this_00 = (collectable->first).
                super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar4 = this_00->_M_use_count;
        do {
          if (iVar4 == 0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar7 = iVar4 == iVar1;
          if (bVar7) {
            this_00->_M_use_count = iVar4 + 1;
            iVar1 = iVar4;
          }
          iVar4 = iVar1;
          UNLOCK();
        } while (!bVar7);
      }
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = this_00->_M_use_count == 0;
      }
      peVar3 = (collectable->first).
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      cVar6 = '\x03';
      if (peVar3 != (element_type *)0x0 && !bVar7) {
        (*peVar3->_vptr_Collectable[2])(&local_48);
        Serializer::Serialize_abi_cxx11_(&local_88,&local_90,&local_48);
        getUri(&local_68,this,collectable);
        iVar4 = detail::CurlWrapper::performHttpRequest
                          ((this->curlWrapper_)._M_t.
                           super___uniq_ptr_impl<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_prometheus::detail::CurlWrapper_*,_std::default_delete<prometheus::detail::CurlWrapper>_>
                           .super__Head_base<0UL,_prometheus::detail::CurlWrapper_*,_false>.
                           _M_head_impl,method,&local_68,&local_88);
        cVar6 = iVar4 - 400U < 0xfffffed4;
        if ((bool)cVar6) {
          local_ac = iVar4;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                  (&local_48);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((cVar6 != '\x03') && (iVar4 = local_ac, cVar6 != '\0')) goto LAB_0010775a;
      collectable = collectable + 1;
    } while (collectable != ppVar2);
    iVar4 = 200;
  }
LAB_0010775a:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return iVar4;
}

Assistant:

int Gateway::push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = serializer.Serialize(metrics);
    auto uri = getUri(wcollectable);
    auto status_code = curlWrapper_->performHttpRequest(method, uri, body);

    if (status_code < 100 || status_code >= 400) {
      return status_code;
    }
  }

  return 200;
}